

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedPrimitiveFieldGenerator::GenerateSerializedSizeCode
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Type type;
  int iVar2;
  FieldOptions *pFVar3;
  Printer *printer_local;
  RepeatedPrimitiveFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,"{\n  int dataSize = 0;\n");
  io::Printer::Indent(printer);
  type = GetType(this->descriptor_);
  iVar2 = anon_unknown_3::FixedSize(type);
  if (iVar2 == -1) {
    io::Printer::Print(printer,&this->variables_,
                       "for (int i = 0; i < $name$_.size(); i++) {\n  dataSize += com.google.protobuf.CodedOutputStream\n    .compute$capitalized_type$SizeNoTag($name$_.get(i));\n}\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "dataSize = $fixed_size$ * get$capitalized_name$List().size();\n");
  }
  io::Printer::Print(printer,"size += dataSize;\n");
  pFVar3 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(pFVar3);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (!get$capitalized_name$List().isEmpty()) {\n  size += $tag_size$;\n  size += com.google.protobuf.CodedOutputStream\n      .computeInt32SizeNoTag(dataSize);\n}\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "size += $tag_size$ * get$capitalized_name$List().size();\n");
  }
  pFVar3 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(pFVar3);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"$name$MemoizedSerializedSize = dataSize;\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "{\n"
    "  int dataSize = 0;\n");
  printer->Indent();

  if (FixedSize(GetType(descriptor_)) == -1) {
    printer->Print(variables_,
      "for (int i = 0; i < $name$_.size(); i++) {\n"
      "  dataSize += com.google.protobuf.CodedOutputStream\n"
      "    .compute$capitalized_type$SizeNoTag($name$_.get(i));\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "dataSize = $fixed_size$ * get$capitalized_name$List().size();\n");
  }

  printer->Print(
      "size += dataSize;\n");

  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "if (!get$capitalized_name$List().isEmpty()) {\n"
      "  size += $tag_size$;\n"
      "  size += com.google.protobuf.CodedOutputStream\n"
      "      .computeInt32SizeNoTag(dataSize);\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "size += $tag_size$ * get$capitalized_name$List().size();\n");
  }

  // cache the data size for packed fields.
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "$name$MemoizedSerializedSize = dataSize;\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}